

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O2

bitset_container_t * bitset_container_from_array(array_container_t *ac)

{
  ushort uVar1;
  ulong uVar2;
  bitset_container_t *pbVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  pbVar3 = bitset_container_create();
  uVar5 = 0;
  uVar4 = (ulong)(uint)ac->cardinality;
  if (ac->cardinality < 1) {
    uVar4 = uVar5;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    uVar1 = ac->array[uVar5];
    uVar2 = pbVar3->words[uVar1 >> 6];
    uVar6 = uVar2 | 1L << ((ulong)uVar1 & 0x3f);
    pbVar3->cardinality = pbVar3->cardinality + (int)((uVar2 ^ uVar6) >> ((byte)uVar1 & 0x3f));
    pbVar3->words[uVar1 >> 6] = uVar6;
  }
  return pbVar3;
}

Assistant:

bitset_container_t *bitset_container_from_array(const array_container_t *ac) {
    bitset_container_t *ans = bitset_container_create();
    int limit = array_container_cardinality(ac);
    for (int i = 0; i < limit; ++i) bitset_container_set(ans, ac->array[i]);
    return ans;
}